

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostViolation
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer pnVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  type_conflict5 tVar15;
  VarStatus VVar16;
  uint uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_88;
  uint *local_38;
  
  bVar3 = this->_hasBasis;
  if (bVar3 == true) {
    _syncRealSolution(this);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
    local_38 = (maxviol->m_backend).data._M_elems + 1;
    uVar17 = (this->_realLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    while (0 < (int)uVar17) {
      uVar1 = uVar17 - 1;
      VVar16 = basisColStatus(this,uVar17 - 1);
      uVar17 = uVar1;
      if (this->_currentSettings->_intParamValues[0] == -1) {
        if ((VVar16 & ~FIXED) != ON_UPPER) {
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          tVar15 = boost::multiprecision::operator<
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_88)
          ;
          if (tVar15) {
            pnVar9 = (this->_solReal)._redCost.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar1].m_backend.data;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar9[uVar1].m_backend.data + 8);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x10);
            local_88.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x20);
            local_88.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            uVar12 = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x30);
            uVar13 = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            local_88.data._M_elems[0xc] = (uint)uVar13;
            local_88.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_88.data._M_elems[0xe] = (uint)uVar14;
            local_88.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
            local_88.data._M_elems[10] = (uint)uVar12;
            local_88.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_88.exp = pnVar9[uVar1].m_backend.exp;
            local_88.neg = pnVar9[uVar1].m_backend.neg;
            local_88.fpclass = pnVar9[uVar1].m_backend.fpclass;
            local_88.prec_elem = pnVar9[uVar1].m_backend.prec_elem;
            if (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&sumviol->m_backend,&local_88);
            local_88.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
            uVar12 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 10);
            uVar13 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc);
            uVar14 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe);
            local_88.data._M_elems[0xc] = (uint)uVar13;
            local_88.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_88.data._M_elems[0xe] = (uint)uVar14;
            local_88.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
            local_88.data._M_elems[10] = (uint)uVar12;
            local_88.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_88.exp = (maxviol->m_backend).exp;
            local_88.neg = (maxviol->m_backend).neg;
            local_88.fpclass = (maxviol->m_backend).fpclass;
            local_88.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
            tVar15 = boost::multiprecision::operator<
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_88);
            if (tVar15) {
              pnVar9 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = pnVar9[uVar1].m_backend.data._M_elems[0];
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x30);
              uVar12 = *(undefined8 *)(puVar2 + 2);
              local_88.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
              local_88.data._M_elems[0xd] = (uint)uVar12;
              local_88.data._M_elems[0xe] = (uint)((ulong)uVar12 >> 0x20);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x24);
              local_88.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              uVar13 = *(undefined8 *)(puVar2 + 2);
              local_88.data._M_elems[10] = (uint)uVar13;
              local_88.data._M_elems[0xb] = (uint)((ulong)uVar13 >> 0x20);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x14);
              local_88.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 4);
              local_88.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              iVar6 = pnVar9[uVar1].m_backend.exp;
              uVar8 = pnVar9[uVar1].m_backend.fpclass;
              uVar11 = pnVar9[uVar1].m_backend.prec_elem;
              bVar4 = pnVar9[uVar1].m_backend.neg;
              (maxviol->m_backend).data._M_elems[0] = uVar5;
              *(ulong *)(local_38 + 0xb) =
                   CONCAT44(local_88.data._M_elems[0xc],local_88.data._M_elems[0xb]);
              *(undefined8 *)(local_38 + 0xd) = uVar12;
              *(undefined8 *)(local_38 + 8) = local_88.data._M_elems._32_8_;
              *(undefined8 *)(local_38 + 10) = uVar13;
              *(undefined8 *)(local_38 + 4) = local_88.data._M_elems._16_8_;
              *(undefined8 *)(local_38 + 6) = local_88.data._M_elems._24_8_;
              *(undefined8 *)local_38 = local_88.data._M_elems._0_8_;
              *(undefined8 *)(local_38 + 2) = local_88.data._M_elems._8_8_;
              (maxviol->m_backend).exp = iVar6;
              (maxviol->m_backend).neg = (bool)((uVar5 != 0 || uVar8 != 0) ^ bVar4);
              (maxviol->m_backend).fpclass = uVar8;
              (maxviol->m_backend).prec_elem = uVar11;
            }
          }
        }
        if (VVar16 - ZERO < 0xfffffffe) {
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          tVar15 = boost::multiprecision::operator>
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_88)
          ;
          if (tVar15) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&sumviol->m_backend,
                       &(this->_solReal)._redCost.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            tVar15 = boost::multiprecision::operator>
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,maxviol);
            if (tVar15) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._redCost.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            }
          }
        }
      }
      else {
        if ((VVar16 & ~FIXED) != ON_UPPER) {
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          tVar15 = boost::multiprecision::operator>
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_88)
          ;
          if (tVar15) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&sumviol->m_backend,
                       &(this->_solReal)._redCost.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            tVar15 = boost::multiprecision::operator>
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,maxviol);
            if (tVar15) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._redCost.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            }
          }
        }
        if (VVar16 - ZERO < 0xfffffffe) {
          local_88.data._M_elems[0] = 0;
          local_88.data._M_elems[1] = 0;
          tVar15 = boost::multiprecision::operator<
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_88)
          ;
          if (tVar15) {
            pnVar9 = (this->_solReal)._redCost.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[uVar1].m_backend.data;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar9[uVar1].m_backend.data + 8);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x10);
            local_88.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x20);
            local_88.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            uVar12 = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x30);
            uVar13 = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            local_88.data._M_elems[0xc] = (uint)uVar13;
            local_88.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_88.data._M_elems[0xe] = (uint)uVar14;
            local_88.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
            local_88.data._M_elems[10] = (uint)uVar12;
            local_88.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_88.exp = pnVar9[uVar1].m_backend.exp;
            local_88.neg = pnVar9[uVar1].m_backend.neg;
            local_88.fpclass = pnVar9[uVar1].m_backend.fpclass;
            local_88.prec_elem = pnVar9[uVar1].m_backend.prec_elem;
            if (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&sumviol->m_backend,&local_88);
            local_88.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
            uVar12 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 10);
            uVar13 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc);
            uVar14 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe);
            local_88.data._M_elems[0xc] = (uint)uVar13;
            local_88.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_88.data._M_elems[0xe] = (uint)uVar14;
            local_88.data._M_elems[0xf] = (uint)((ulong)uVar14 >> 0x20);
            local_88.data._M_elems[10] = (uint)uVar12;
            local_88.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_88.exp = (maxviol->m_backend).exp;
            local_88.neg = (maxviol->m_backend).neg;
            local_88.fpclass = (maxviol->m_backend).fpclass;
            local_88.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_88.fpclass != cpp_dec_float_finite || local_88.data._M_elems[0] != 0) {
              local_88.neg = (bool)(local_88.neg ^ 1);
            }
            tVar15 = boost::multiprecision::operator<
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_88);
            if (tVar15) {
              pnVar9 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = pnVar9[uVar1].m_backend.data._M_elems[0];
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x30);
              uVar12 = *(undefined8 *)(puVar2 + 2);
              local_88.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
              local_88.data._M_elems[0xd] = (uint)uVar12;
              local_88.data._M_elems[0xe] = (uint)((ulong)uVar12 >> 0x20);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x24);
              local_88.data._M_elems._32_8_ = *(undefined8 *)puVar2;
              uVar13 = *(undefined8 *)(puVar2 + 2);
              local_88.data._M_elems[10] = (uint)uVar13;
              local_88.data._M_elems[0xb] = (uint)((ulong)uVar13 >> 0x20);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 0x14);
              local_88.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar9[uVar1].m_backend.data + 4);
              local_88.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              iVar6 = pnVar9[uVar1].m_backend.exp;
              uVar7 = pnVar9[uVar1].m_backend.fpclass;
              uVar10 = pnVar9[uVar1].m_backend.prec_elem;
              bVar4 = pnVar9[uVar1].m_backend.neg;
              (maxviol->m_backend).data._M_elems[0] = uVar5;
              *(ulong *)(local_38 + 0xb) =
                   CONCAT44(local_88.data._M_elems[0xc],local_88.data._M_elems[0xb]);
              *(undefined8 *)(local_38 + 0xd) = uVar12;
              *(undefined8 *)(local_38 + 8) = local_88.data._M_elems._32_8_;
              *(undefined8 *)(local_38 + 10) = uVar13;
              *(undefined8 *)(local_38 + 4) = local_88.data._M_elems._16_8_;
              *(undefined8 *)(local_38 + 6) = local_88.data._M_elems._24_8_;
              *(undefined8 *)local_38 = local_88.data._M_elems._0_8_;
              *(undefined8 *)(local_38 + 2) = local_88.data._M_elems._8_8_;
              (maxviol->m_backend).exp = iVar6;
              (maxviol->m_backend).neg = (bool)((uVar5 != 0 || uVar7 != 0) ^ bVar4);
              (maxviol->m_backend).fpclass = uVar7;
              (maxviol->m_backend).prec_elem = uVar10;
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getRedCostViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& redcost = _solReal._redCost;
   assert(redcost.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int c = numCols() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus colStatus = basisColStatus(c);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }
      }
      else
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }
      }
   }

   return true;
}